

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_gf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  undefined *puVar1;
  undefined *puVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = (int)p_rc;
  uVar3 = bit_depth - AOM_BITS_8;
  if (uVar3 < 5) {
    puVar1 = (&PTR_arfgf_low_motion_minq_8_005d39e8)[uVar3];
    puVar2 = (&PTR_arfgf_high_motion_minq_8_005d3a10)[uVar3];
  }
  else {
    puVar1 = (undefined *)0x0;
    puVar2 = (undefined *)0x0;
  }
  if (0x960 < iVar4) {
    return *(int *)(puVar1 + (long)q * 4);
  }
  if (iVar4 < 300) {
    return *(int *)(puVar2 + (long)q * 4);
  }
  return ((*(int *)(puVar2 + (long)q * 4) - *(int *)(puVar1 + (long)q * 4)) * (0x960 - iVar4) +
         0x41a) / 0x834 + *(int *)(puVar1 + (long)q * 4);
}

Assistant:

static int get_gf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  return get_gf_active_quality_no_rc(p_rc->gfu_boost, q, bit_depth);
}